

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

string * anon_unknown.dwarf_f0d851::ConvertToMakefilePathForUnix
                   (string *__return_storage_ptr__,string *path)

{
  char cVar1;
  bool bVar2;
  reference pcVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_48;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  string *path_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_48._M_current = (char *)std::__cxx11::string::end();
  do {
    bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffb8);
    if (!bVar2) {
      return __return_storage_ptr__;
    }
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    cVar1 = *pcVar3;
    if ((cVar1 == ' ') || (cVar1 == '#')) {
LAB_00752026:
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
LAB_00752038:
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    else if (cVar1 == '$') {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      if (cVar1 != '=') {
        if (cVar1 == '\\') goto LAB_00752026;
        goto LAB_00752038;
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

std::string ConvertToMakefilePathForUnix(std::string const& path)
{
  std::string result;
  result.reserve(path.size());
  for (char c : path) {
    switch (c) {
      case '=':
        // We provide 'EQUALS = =' to encode '=' in a non-assignment case.
        result.append("$(EQUALS)");
        break;
      case '$':
        result.append("$$");
        break;
      case '\\':
      case ' ':
      case '#':
        result.push_back('\\');
        CM_FALLTHROUGH;
      default:
        result.push_back(c);
        break;
    }
  }
  return result;
}